

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_bitops(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int lsb,int msb)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  uint len;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t_00,rs);
  switch(opc) {
  case 0x7c000000:
    if (0x1f < msb + lsb) goto switchD_00876b29_default;
    if (msb == 0x1f) {
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,t,t_00);
      goto LAB_00876c2e;
    }
    len = msb + 1;
    goto LAB_00876bcc;
  case 0x7c000001:
    msb = msb + 0x20;
switchD_00876b29_caseD_7c000003:
LAB_00876bb2:
    if (lsb + msb < 0x40) {
      len = msb + 1;
LAB_00876bcc:
      tcg_gen_extract_i64_mips64el(tcg_ctx,t,t_00,lsb,len);
LAB_00876c2e:
      gen_store_gpr(tcg_ctx,t,rt);
    }
    else {
switchD_00876b29_default:
      generate_exception_end(ctx,0x14);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
    return;
  case 0x7c000002:
    lsb = lsb + 0x20;
    goto LAB_00876bb2;
  case 0x7c000003:
    goto switchD_00876b29_caseD_7c000003;
  case 0x7c000004:
    if (msb < lsb) goto switchD_00876b29_default;
    gen_load_gpr(tcg_ctx,t,rt);
    tcg_gen_deposit_i64_mips64el(tcg_ctx,t,t,t_00,lsb,(msb - lsb) + 1);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,t,t);
    goto LAB_00876c2e;
  case 0x7c000005:
    goto switchD_00876b29_caseD_7c000005;
  case 0x7c000006:
    lsb = lsb + 0x20;
switchD_00876b29_caseD_7c000005:
    msb = msb + 0x20;
switchD_00876b29_caseD_7c000007:
    if (msb < lsb) goto switchD_00876b29_default;
    gen_load_gpr(tcg_ctx,t,rt);
    tcg_gen_deposit_i64_mips64el(tcg_ctx,t,t,t_00,lsb,(msb - lsb) + 1);
    goto LAB_00876c2e;
  case 0x7c000007:
    goto switchD_00876b29_caseD_7c000007;
  default:
    goto switchD_00876b29_default;
  }
}

Assistant:

static void gen_bitops(DisasContext *ctx, uint32_t opc, int rt,
                       int rs, int lsb, int msb)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t1, rs);
    switch (opc) {
    case OPC_EXT:
        if (lsb + msb > 31) {
            goto fail;
        }
        if (msb != 31) {
            tcg_gen_extract_tl(tcg_ctx, t0, t1, lsb, msb + 1);
        } else {
            /*
             * The two checks together imply that lsb == 0,
             * so this is a simple sign-extension.
             */
            tcg_gen_ext32s_tl(tcg_ctx, t0, t1);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DEXTU:
        lsb += 32;
        goto do_dext;
    case OPC_DEXTM:
        msb += 32;
        goto do_dext;
    case OPC_DEXT:
    do_dext:
        if (lsb + msb > 63) {
            goto fail;
        }
        tcg_gen_extract_tl(tcg_ctx, t0, t1, lsb, msb + 1);
        break;
#endif
    case OPC_INS:
        if (lsb > msb) {
            goto fail;
        }
        gen_load_gpr(tcg_ctx, t0, rt);
        tcg_gen_deposit_tl(tcg_ctx, t0, t0, t1, lsb, msb - lsb + 1);
        tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DINSU:
        lsb += 32;
        /* FALLTHRU */
    case OPC_DINSM:
        msb += 32;
        /* FALLTHRU */
    case OPC_DINS:
        if (lsb > msb) {
            goto fail;
        }
        gen_load_gpr(tcg_ctx, t0, rt);
        tcg_gen_deposit_tl(tcg_ctx, t0, t0, t1, lsb, msb - lsb + 1);
        break;
#endif
    default:
fail:
        MIPS_INVAL("bitops");
        generate_exception_end(ctx, EXCP_RI);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);
        return;
    }
    gen_store_gpr(tcg_ctx, t0, rt);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}